

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToString.hpp
# Opt level: O0

ParseNonIterableToString<IsNotNaNTests::Run()::NotANumber> * __thiscall
ut11::utility::detail::ParseNonIterableToString<IsNotNaNTests::Run()::NotANumber>::
ToString_abi_cxx11_(ParseNonIterableToString<IsNotNaNTests::Run()::NotANumber> *this,
                   NotANumber *value,undefined8 param_3)

{
  ostream *poVar1;
  char *pcVar2;
  stringstream local_1b0 [8];
  stringstream stream;
  ostream local_1a0 [376];
  undefined8 local_28;
  NotANumber *value_local;
  ParseNonIterableToString<NotANumber> *this_local;
  ParseNonIterableToString<IsNotNaNTests::Run()::NotANumber> *local_10;
  
  local_28 = param_3;
  value_local = value;
  local_10 = this;
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = std::operator<<(local_1a0,"[");
  pcVar2 = std::type_info::name((type_info *)&IsNotNaNTests::Run()::NotANumber::typeinfo);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"]");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return this;
}

Assistant:

inline std::string ToString(const V& value, std::false_type) const
				{
					std::stringstream stream;
					stream << "[" << typeid(V).name() << "]";
					return stream.str();
				}